

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_inertia.cpp
# Opt level: O2

Reals Omega_h::inertia::anon_unknown_0::get_distances(Reals *coords,Vector<3> center,Vector<3> axis)

{
  Alloc *pAVar1;
  double dVar2;
  uint size_in;
  void *extraout_RDX;
  Write<double> *in_RSI;
  size_t sVar3;
  ulong uVar4;
  Int j;
  long lVar5;
  Reals RVar6;
  Write<double> distances;
  double local_168 [3];
  Write<signed_char> local_150;
  Write<double> local_140;
  Write<double> local_130;
  double local_120;
  double dStack_118;
  double local_110;
  double dStack_108;
  double local_100;
  double dStack_f8;
  Vector<3> c;
  string local_d8;
  double local_b8;
  double dStack_b0;
  double local_a8;
  double dStack_a0;
  double local_98;
  double dStack_90;
  type f;
  Vector<3> v;
  
  pAVar1 = (in_RSI->shared_alloc_).alloc;
  if (((ulong)pAVar1 & 1) == 0) {
    sVar3 = pAVar1->size;
  }
  else {
    sVar3 = (ulong)pAVar1 >> 3;
  }
  size_in = divide_no_remainder<int>((int)(sVar3 >> 3),3);
  std::__cxx11::string::string((string *)&local_d8,"",(allocator *)&local_140);
  Write<double>::Write(&distances,size_in,&local_d8);
  std::__cxx11::string::~string((string *)&local_d8);
  Write<double>::Write(&f.distances,&distances);
  Write<double>::Write(&f.coords.write_,in_RSI);
  f.center.super_Few<double,_3>.array_[2] = center.super_Few<double,_3>.array_[2];
  f.center.super_Few<double,_3>.array_[0] = center.super_Few<double,_3>.array_[0];
  f.center.super_Few<double,_3>.array_[1] = center.super_Few<double,_3>.array_[1];
  f.axis.super_Few<double,_3>.array_[0] = axis.super_Few<double,_3>.array_[0];
  f.axis.super_Few<double,_3>.array_[1] = axis.super_Few<double,_3>.array_[1];
  f.axis.super_Few<double,_3>.array_[2] = axis.super_Few<double,_3>.array_[2];
  Write<double>::Write(&local_140,&f.distances);
  Write<double>::Write(&local_130,&f.coords.write_);
  local_100 = f.axis.super_Few<double,_3>.array_[1];
  dStack_f8 = f.axis.super_Few<double,_3>.array_[2];
  local_110 = f.center.super_Few<double,_3>.array_[2];
  dStack_108 = f.axis.super_Few<double,_3>.array_[0];
  local_120 = f.center.super_Few<double,_3>.array_[0];
  dStack_118 = f.center.super_Few<double,_3>.array_[1];
  if (0 < (int)size_in) {
    entering_parallel = 1;
    Write<double>::Write((Write<signed_char> *)&local_d8,(Write<signed_char> *)&local_140);
    Write<double>::Write((Write<signed_char> *)&local_d8.field_2,(Write<signed_char> *)&local_130);
    local_98 = local_100;
    dStack_90 = dStack_f8;
    local_a8 = local_110;
    dStack_a0 = dStack_108;
    local_b8 = local_120;
    dStack_b0 = dStack_118;
    entering_parallel = 0;
    for (uVar4 = 0; uVar4 != size_in; uVar4 = uVar4 + 1) {
      for (lVar5 = 0; lVar5 != 3; lVar5 = lVar5 + 1) {
        v.super_Few<double,_3>.array_[lVar5] = *(double *)(local_d8.field_2._8_8_ + lVar5 * 8);
      }
      local_168[2] = local_110;
      local_168[0] = local_120;
      local_168[1] = dStack_118;
      for (lVar5 = 0; lVar5 != 3; lVar5 = lVar5 + 1) {
        c.super_Few<double,_3>.array_[lVar5] =
             v.super_Few<double,_3>.array_[lVar5] - local_168[lVar5];
      }
      local_168[0] = dStack_108;
      local_168[1] = local_100;
      local_168[2] = dStack_f8;
      dVar2 = c.super_Few<double,_3>.array_[0] * dStack_108;
      for (lVar5 = 1; lVar5 != 3; lVar5 = lVar5 + 1) {
        dVar2 = dVar2 + c.super_Few<double,_3>.array_[lVar5] * local_168[lVar5];
      }
      *(double *)(local_d8._M_string_length + uVar4 * 8) = dVar2;
      local_d8.field_2._8_8_ = local_d8.field_2._8_8_ + 0x18;
    }
    (anonymous_namespace)::
    get_distances(Omega_h::Read<double>,Omega_h::Vector<3>,Omega_h::Vector<3>)::$_0::~__0
              ((__0 *)&local_d8);
  }
  (anonymous_namespace)::get_distances(Omega_h::Read<double>,Omega_h::Vector<3>,Omega_h::Vector<3>)
  ::$_0::~__0((__0 *)&local_140);
  Write<double>::Write(&local_150,(Write<signed_char> *)&distances);
  Read<double>::Read((Read<signed_char> *)coords,(Write<double> *)&local_150);
  Write<double>::~Write((Write<double> *)&local_150);
  (anonymous_namespace)::get_distances(Omega_h::Read<double>,Omega_h::Vector<3>,Omega_h::Vector<3>)
  ::$_0::~__0((__0 *)&f);
  Write<double>::~Write(&distances);
  RVar6.write_.shared_alloc_.direct_ptr = extraout_RDX;
  RVar6.write_.shared_alloc_.alloc = (Alloc *)coords;
  return (Reals)RVar6.write_.shared_alloc_;
}

Assistant:

Reals get_distances(Reals coords, Vector<3> center, Vector<3> axis) {
  auto n = divide_no_remainder(coords.size(), 3);
  Write<Real> distances(n);
  auto f = OMEGA_H_LAMBDA(LO i) {
    distances[i] = (get_vector<3>(coords, i) - center) * axis;
  };
  parallel_for(n, f, "get_distances");
  return distances;
}